

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  double_conversion *this_00;
  ulong uVar5;
  uint uVar6;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  FastDtoaMode FVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  DiyFp DVar20;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  int *kappa;
  undefined4 in_stack_ffffffffffffff18;
  DiyFp boundary_plus;
  int local_ac;
  ulong local_a8;
  DiyFp boundary_minus;
  DiyFp ten_mk_1;
  uint local_7c;
  DiyFp local_78;
  uint64_t local_68;
  int *local_60;
  int local_54;
  DiyFp ten_mk;
  DiyFp too_low;
  
  this_00 = (double_conversion *)CONCAT44(in_register_00000014,requested_digits);
  puVar11 = buffer._8_8_;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x281,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  if (v == INFINITY) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x282,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  uVar10 = (uint)this;
  uVar3 = (uint)buffer.start_;
  ten_mk_1.f_ = (uint64_t)v;
  local_60 = length;
  if (uVar10 < 2) {
    DVar20 = Double::AsNormalizedDiyFp((Double *)&ten_mk_1);
    iVar14 = DVar20.e_;
    boundary_minus.f_ = 0;
    boundary_minus.e_ = 0;
    boundary_plus.f_ = 0;
    boundary_plus.e_ = 0;
    if (uVar10 == 0) {
      ten_mk_1.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&ten_mk_1,&boundary_minus,&boundary_plus);
      uVar10 = uVar3;
    }
    else {
      ten_mk_1.f_ = CONCAT44(ten_mk_1.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&ten_mk_1,&boundary_minus,&boundary_plus);
      uVar10 = uVar3;
    }
    if (boundary_plus.e_ != iVar14) {
      __assert_fail("boundary_plus.e() == w.e()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x219,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    ten_mk.f_ = 0;
    ten_mk.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar14,-0x60 - iVar14,&ten_mk,&local_ac);
    if (0x1c < iVar14 + ten_mk.e_ + 0x7cU) {
      __assert_fail("(kMinimalTargetExponent <= w.e() + ten_mk.e() + DiyFp::kSignificandSize) && (kMaximalTargetExponent >= w.e() + ten_mk.e() + DiyFp::kSignificandSize)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x227,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    if (iVar14 != boundary_plus.e_) {
      __assert_fail("scaled_w.e() == boundary_plus.e() + ten_mk.e() + DiyFp::kSignificandSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x233,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    local_78.e_ = ten_mk.e_ + iVar14 + 0x40;
    uVar5 = ten_mk.f_ & 0xffffffff;
    uVar8 = DVar20.f_ >> 0x20;
    uVar12 = uVar5 * uVar8;
    uVar4 = ten_mk.f_ >> 0x20;
    uVar19 = DVar20.f_ & 0xffffffff;
    uVar15 = uVar4 * uVar19;
    local_78.f_ = ((uVar15 & 0xffffffff) + (uVar19 * uVar5 >> 0x20) + (uVar12 & 0xffffffff) +
                   0x80000000 >> 0x20) + (uVar15 >> 0x20) + uVar8 * uVar4 + (uVar12 >> 0x20);
    if (boundary_minus.e_ != iVar14) {
      __assert_fail("low.e() == w.e() && w.e() == high.e()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x132,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    uVar12 = (boundary_minus.f_ & 0xffffffff) * uVar4;
    uVar8 = (boundary_minus.f_ >> 0x20) * uVar5;
    lVar9 = ((uVar12 & 0xffffffff) +
             (uVar8 & 0xffffffff) + ((boundary_minus.f_ & 0xffffffff) * uVar5 >> 0x20) + 0x80000000
            >> 0x20) + (uVar12 >> 0x20) + (uVar8 >> 0x20) + (boundary_minus.f_ >> 0x20) * uVar4;
    uVar8 = uVar4 * (boundary_plus.f_ & 0xffffffff);
    uVar12 = (boundary_plus.f_ >> 0x20) * uVar5;
    lVar18 = ((uVar8 & 0xffffffff) +
              (uVar12 & 0xffffffff) + ((boundary_plus.f_ & 0xffffffff) * uVar5 >> 0x20) + 0x80000000
             >> 0x20) + (uVar8 >> 0x20) + (uVar12 >> 0x20) + (boundary_plus.f_ >> 0x20) * uVar4;
    if (lVar18 - 1U < lVar9 + 1U) {
      __assert_fail("low.f() + 1 <= high.f() - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x133,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    iVar14 = boundary_minus.e_ + ten_mk.e_;
    iVar17 = iVar14 + 0x40;
    if (0x1c < iVar14 + 0x7cU) {
      __assert_fail("kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x134,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    too_low.f_ = lVar9 - 1;
    uVar12 = lVar18 + 1;
    ten_mk_1.f_ = uVar12;
    ten_mk_1.e_ = iVar17;
    too_low.e_ = iVar17;
    DiyFp::Subtract(&ten_mk_1,&too_low);
    uVar5 = ten_mk_1.f_;
    uVar7 = 1;
    bVar2 = (byte)-iVar17;
    local_68 = 1L << (bVar2 & 0x3f);
    uVar4 = uVar12 >> (bVar2 & 0x3f);
    uVar8 = local_68 - 1;
    uVar19 = uVar12 & uVar8;
    local_a8 = uVar12;
    BiggestPowerTen((uint32_t)uVar4,iVar14 + 0x80,&local_7c,&local_54);
    *puVar11 = 0;
    if (local_54 < 1) {
      uVar6 = 0;
    }
    else {
      uVar12 = (ulong)local_7c;
      uVar13 = local_54 + 1;
      uVar6 = 0;
      do {
        uVar15 = (uVar4 & 0xffffffff) / uVar12;
        uVar4 = (uVar4 & 0xffffffff) % uVar12;
        if (9 < (int)uVar15) {
          __assert_fail("digit <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                        ,0x15e,
                        "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                       );
        }
        if (((int)uVar6 < 0) || ((int)uVar10 <= (int)uVar6)) goto LAB_0016d423;
        this_00[uVar6] = (double_conversion)((char)uVar15 + '0');
        uVar6 = *puVar11 + 1;
        *puVar11 = uVar6;
        uVar15 = (uVar4 << (bVar2 & 0x3f)) + uVar19;
        if (uVar15 < uVar5) {
          ten_mk_1.f_ = local_a8;
          uVar3 = uVar10;
          ten_mk_1.e_ = iVar17;
          DiyFp::Subtract(&ten_mk_1,&local_78);
          buffer_01.start_ = (ulong)uVar10;
          buffer_01.length_ = uVar6;
          buffer_01._12_4_ = 0;
          bVar1 = RoundWeed(this_00,buffer_01,(int)ten_mk_1.f_,uVar5,uVar15,uVar12 << (bVar2 & 0x3f)
                            ,1,CONCAT44(uVar3,in_stack_ffffffffffffff18));
          if (!bVar1) goto LAB_0016d40f;
          iVar14 = (uVar13 - local_ac) + -2;
          goto LAB_0016d3e1;
        }
        uVar12 = uVar12 / 10;
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
      if (iVar17 < -0x3c) {
        __assert_fail("one.e() >= -60",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x179,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      if (0x3c < (uint)-iVar17) {
        __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x17b,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      local_54 = 0;
    }
    do {
      uVar4 = uVar19 * 10 >> (bVar2 & 0x3f);
      if (9 < (int)uVar4) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x182,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      if (((int)uVar6 < 0) || ((int)uVar10 <= (int)uVar6)) goto LAB_0016d423;
      uVar7 = uVar7 * 10;
      uVar5 = uVar5 * 10;
      this_00[uVar6] = (double_conversion)((char)uVar4 + '0');
      uVar6 = *puVar11 + 1;
      *puVar11 = uVar6;
      uVar19 = uVar19 * 10 & uVar8;
      iVar14 = local_54 + -1;
      local_54 = iVar14;
    } while (uVar5 <= uVar19);
    ten_mk_1.f_ = local_a8;
    uVar4 = (ulong)uVar10;
    ten_mk_1.e_ = iVar17;
    DiyFp::Subtract(&ten_mk_1,&local_78);
    buffer_00.length_ = uVar6;
    buffer_00.start_ = (char *)uVar4;
    buffer_00._12_4_ = 0;
    bVar1 = RoundWeed(this_00,buffer_00,(int)ten_mk_1.f_ * (int)uVar7,uVar5,uVar19,local_68,uVar7,
                      CONCAT44(uVar10,in_stack_ffffffffffffff18));
    if (!bVar1) goto LAB_0016d40f;
    iVar14 = iVar14 - local_ac;
    uVar3 = uVar10;
LAB_0016d3e1:
    *local_60 = iVar14 + *puVar11;
    uVar10 = *puVar11;
    if (((long)(int)uVar10 < 0) || ((int)uVar3 <= (int)uVar10)) {
LAB_0016d423:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xcc,
                    "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
    }
    this_00[(int)uVar10] = (double_conversion)0x0;
    bVar1 = true;
  }
  else {
    if (uVar10 != 2) {
      abort();
    }
    DVar20 = Double::AsNormalizedDiyFp((Double *)&ten_mk_1);
    iVar14 = DVar20.e_;
    ten_mk_1.f_ = 0;
    ten_mk_1.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar14,-0x60 - iVar14,&ten_mk_1,(int *)&boundary_minus);
    if (0x1c < ten_mk_1.e_ + iVar14 + 0x7cU) {
      __assert_fail("(kMinimalTargetExponent <= w.e() + ten_mk.e() + DiyFp::kSignificandSize) && (kMaximalTargetExponent >= w.e() + ten_mk.e() + DiyFp::kSignificandSize)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x262,
                    "bool FIX::double_conversion::Grisu3Counted(double, int, Vector<char>, int *, int *)"
                   );
    }
    uVar10 = ten_mk_1.e_ + iVar14;
    local_a8 = (ulong)uVar10;
    uVar5 = DVar20.f_ >> 0x20;
    uVar8 = (ten_mk_1.f_ & 0xffffffff) * uVar5;
    uVar12 = DVar20.f_ & 0xffffffff;
    uVar4 = (ten_mk_1.f_ >> 0x20) * uVar12;
    uVar5 = ((uVar4 & 0xffffffff) +
             ((ten_mk_1.f_ & 0xffffffff) * uVar12 >> 0x20) + (uVar8 & 0xffffffff) + 0x80000000 >>
            0x20) + (uVar4 >> 0x20) + uVar5 * (ten_mk_1.f_ >> 0x20) + (uVar8 >> 0x20);
    bVar2 = -(char)uVar10;
    uVar7 = 1L << (bVar2 & 0x3f);
    uVar4 = uVar5 >> (bVar2 & 0x3f);
    bVar2 = -(char)uVar10 - 0x40;
    uVar5 = uVar5 & uVar7 - 1;
    kappa = (int *)0x16ce02;
    BiggestPowerTen((uint32_t)uVar4,uVar10 + 0x80,(uint32_t *)&local_78,(int *)&too_low);
    boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,(int)too_low.f_);
    *puVar11 = 0;
    uVar10 = (uint)local_78.f_;
    if ((int)too_low.f_ < 1) {
      uVar6 = 0;
      FVar16 = mode;
      iVar14 = (int)too_low.f_;
    }
    else {
      iVar14 = (int)too_low.f_ + 1;
      uVar6 = 0;
      FVar16 = mode;
      do {
        FVar16 = FVar16 - FAST_DTOA_SHORTEST_SINGLE;
        uVar8 = (uVar4 & 0xffffffff) / (ulong)uVar10;
        uVar4 = (uVar4 & 0xffffffff) % (ulong)uVar10;
        if (9 < (int)uVar8) {
          __assert_fail("digit <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                        ,0x1cd,
                        "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                       );
        }
        if (((int)uVar6 < 0) || ((int)uVar3 <= (int)uVar6)) goto LAB_0016d423;
        this_00[uVar6] = (double_conversion)((char)uVar8 + '0');
        uVar6 = *puVar11 + 1;
        *puVar11 = uVar6;
        if (FVar16 == FAST_DTOA_SHORTEST) {
          boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,(int)too_low.f_ - mode);
          goto LAB_0016d39b;
        }
        uVar10 = uVar10 / 10;
        iVar14 = iVar14 + -1;
      } while (1 < iVar14);
      boundary_plus.f_ = (ulong)boundary_plus.f_._4_4_ << 0x20;
      FVar16 = mode - (int)too_low.f_;
      iVar14 = 0;
    }
    if (FVar16 == FAST_DTOA_SHORTEST) {
LAB_0016d39b:
      iVar14 = (int)((uVar4 & 0xffffffff) << (bVar2 & 0x3f)) + (int)uVar5;
      uVar7 = (ulong)uVar10 << (bVar2 & 0x3f);
      uVar4 = 1;
LAB_0016d3cc:
      buffer_02.start_ = (ulong)uVar3;
      buffer_02.length_ = uVar6;
      buffer_02._12_4_ = 0;
      bVar1 = RoundWeedCounted(this_00,buffer_02,iVar14,uVar7,uVar4,(uint64_t)&boundary_plus,kappa);
      if (bVar1) {
        iVar14 = (int)boundary_plus.f_ - (int)boundary_minus.f_;
        goto LAB_0016d3e1;
      }
    }
    else {
      if ((uint)local_a8 < 0xffffff84) {
        __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x1e9,
                      "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                     );
      }
      if ((0 < (int)FVar16) && (1 < uVar5)) {
        uVar4 = 1;
        do {
          uVar8 = uVar5 * 10 >> (bVar2 & 0x3f);
          if (9 < (int)uVar8) {
            __assert_fail("digit <= 9",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                          ,0x1ef,
                          "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                         );
          }
          if (((int)uVar6 < 0) || ((int)uVar3 <= (int)uVar6)) goto LAB_0016d423;
          iVar17 = (mode - (int)too_low.f_) + iVar14;
          uVar4 = uVar4 * 10;
          this_00[uVar6] = (double_conversion)((char)uVar8 + '0');
          uVar6 = *puVar11 + 1;
          *puVar11 = uVar6;
          uVar5 = uVar5 * 10 & uVar7 - 1;
          iVar14 = iVar14 + -1;
        } while ((1 < iVar17) && (uVar4 < uVar5));
        boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar14);
        if ((mode - (int)too_low.f_) + iVar14 == 0) {
          iVar14 = (int)uVar5;
          goto LAB_0016d3cc;
        }
      }
    }
LAB_0016d40f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}